

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImproperCosineInversionType.cpp
# Opt level: O3

void __thiscall
OpenMD::ImproperCosineInversionType::ImproperCosineInversionType
          (ImproperCosineInversionType *this,
          vector<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
          *parameters)

{
  _Rb_tree_header *p_Var1;
  int maxPower;
  pointer pIVar2;
  pointer pIVar3;
  pointer pIVar4;
  pointer pIVar5;
  double dVar6;
  ChebyshevU U;
  ChebyshevT T;
  DoublePolynomial sinTerm;
  DoublePolynomial cosTerm;
  RealType local_170;
  _Rb_tree_node_base local_168;
  size_t local_148;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_140;
  ChebyshevU local_110;
  ChebyshevT local_e8;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_c0;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_90;
  _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
  local_60;
  
  p_Var1 = &(this->super_PolynomialInversionType).polynomial_.polyPairMap_._M_t._M_impl.
            super__Rb_tree_header;
  (this->super_PolynomialInversionType).polynomial_.polyPairMap_._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_color = _S_red;
  *(_Base_ptr *)
   ((long)&(this->super_PolynomialInversionType).polynomial_.polyPairMap_._M_t._M_impl.
           super__Rb_tree_header._M_header + 8) = (_Base_ptr)0x0;
  *(_Rb_tree_header **)
   ((long)&(this->super_PolynomialInversionType).polynomial_.polyPairMap_._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x10) = p_Var1;
  *(_Rb_tree_header **)
   ((long)&(this->super_PolynomialInversionType).polynomial_.polyPairMap_._M_t._M_impl.
           super__Rb_tree_header._M_header + 0x18) = p_Var1;
  (this->super_PolynomialInversionType).polynomial_.polyPairMap_._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  (this->super_PolynomialInversionType).super_InversionType._vptr_InversionType =
       (_func_int **)&PTR__PolynomialInversionType_00306370;
  pIVar5 = (parameters->
           super__Vector_base<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
           )._M_impl.super__Vector_impl_data._M_start;
  pIVar2 = (parameters->
           super__Vector_base<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
           )._M_impl.super__Vector_impl_data._M_finish;
  pIVar4 = pIVar5 + 1;
  if (pIVar4 != pIVar2 && pIVar5 != pIVar2) {
    do {
      pIVar3 = pIVar4;
      if (pIVar4->n <= pIVar5->n) {
        pIVar3 = pIVar5;
      }
      pIVar5 = pIVar3;
      pIVar4 = pIVar4 + 1;
    } while (pIVar4 != pIVar2);
  }
  if (pIVar5 != pIVar2) {
    maxPower = pIVar5->n;
    ChebyshevT::ChebyshevT(&local_e8,maxPower);
    ChebyshevU::ChebyshevU(&local_110,maxPower);
    local_140._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_140._M_impl.super__Rb_tree_header._M_header;
    local_140._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_140._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_140._M_impl.super__Rb_tree_header._M_node_count = 0;
    pIVar5 = (parameters->
             super__Vector_base<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
             )._M_impl.super__Vector_impl_data._M_start;
    local_140._M_impl.super__Rb_tree_header._M_header._M_right =
         local_140._M_impl.super__Rb_tree_header._M_header._M_left;
    if (pIVar5 != (parameters->
                  super__Vector_base<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      do {
        std::
        _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
        ::_Rb_tree(&local_60,
                   (_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                    *)(local_e8.polyList_.
                       super__Vector_base<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + pIVar5->n));
        dVar6 = cos(pIVar5->delta);
        Polynomial<double>::operator*=((Polynomial<double> *)&local_60,dVar6 * pIVar5->kchi);
        std::
        _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
        ::_Rb_tree(&local_90,
                   (_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                    *)(local_110.polyList_.
                       super__Vector_base<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + pIVar5->n));
        dVar6 = sin(pIVar5->delta);
        Polynomial<double>::operator*=((Polynomial<double> *)&local_90,-dVar6 * pIVar5->kchi);
        operator+((Polynomial<double> *)&local_170,(Polynomial<double> *)&local_60,
                  (Polynomial<double> *)&local_90);
        std::
        _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
        ::clear(&local_140);
        if (local_168._M_parent != (_Base_ptr)0x0) {
          local_140._M_impl.super__Rb_tree_header._M_header._M_color = local_168._M_color;
          local_140._M_impl.super__Rb_tree_header._M_header._M_parent = local_168._M_parent;
          local_140._M_impl.super__Rb_tree_header._M_header._M_left = local_168._M_left;
          local_140._M_impl.super__Rb_tree_header._M_header._M_right = local_168._M_right;
          (local_168._M_parent)->_M_parent = &local_140._M_impl.super__Rb_tree_header._M_header;
          local_140._M_impl.super__Rb_tree_header._M_node_count = local_148;
          local_168._M_parent = (_Base_ptr)0x0;
          local_168._M_left = &local_168;
          local_148 = 0;
          local_168._M_right = local_168._M_left;
        }
        std::
        _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
        ::~_Rb_tree((_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                     *)&local_170);
        local_170 = pIVar5->kchi;
        Polynomial<double>::addCoefficient((Polynomial<double> *)&local_140,0,(double *)&local_170);
        std::
        _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
        ::~_Rb_tree(&local_90);
        std::
        _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
        ::~_Rb_tree(&local_60);
        pIVar5 = pIVar5 + 1;
      } while (pIVar5 != (parameters->
                         super__Vector_base<OpenMD::ImproperCosineInversionParameter,_std::allocator<OpenMD::ImproperCosineInversionParameter>_>
                         )._M_impl.super__Vector_impl_data._M_finish);
    }
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::_Rb_tree(&local_c0,&local_140);
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::operator=((_Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
                 *)&(this->super_PolynomialInversionType).polynomial_,&local_c0);
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::~_Rb_tree(&local_c0);
    std::
    _Rb_tree<int,_std::pair<const_int,_double>,_std::_Select1st<std::pair<const_int,_double>_>,_std::less<int>,_std::allocator<std::pair<const_int,_double>_>_>
    ::~_Rb_tree(&local_140);
    local_110._vptr_ChebyshevU = (_func_int **)&PTR__ChebyshevU_00306310;
    std::vector<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_>::~vector
              (&local_110.polyList_);
    local_e8._vptr_ChebyshevT = (_func_int **)&PTR__ChebyshevT_00306340;
    std::vector<OpenMD::Polynomial<double>,_std::allocator<OpenMD::Polynomial<double>_>_>::~vector
              (&local_e8.polyList_);
  }
  return;
}

Assistant:

ImproperCosineInversionType::ImproperCosineInversionType(
      std::vector<ImproperCosineInversionParameter>& parameters) {
    std::vector<ImproperCosineInversionParameter>::iterator i;
    i = std::max_element(parameters.begin(), parameters.end(),
                         LessThanPeriodicityFunctor());
    if (i != parameters.end()) {
      int maxPower = i->n;
      ChebyshevT T(maxPower);
      ChebyshevU U(maxPower);

      // convert parameters of impropercosine type inversion into
      // PolynomialInversion's parameters
      DoublePolynomial finalPolynomial;
      for (i = parameters.begin(); i != parameters.end(); ++i) {
        DoublePolynomial cosTerm = T.getChebyshevPolynomial(i->n);
        cosTerm *= cos(i->delta) * i->kchi;
        DoublePolynomial sinTerm = U.getChebyshevPolynomial(i->n);
        sinTerm *= -sin(i->delta) * i->kchi;
        finalPolynomial = cosTerm + sinTerm;
        finalPolynomial += i->kchi;
      }
      this->setPolynomial(finalPolynomial);
    }
  }